

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io__file.cc
# Opt level: O3

void __thiscall xemmai::io::t_file::f_blocking__(t_file *this,bool a_value)

{
  t_queue<128UL> *ptVar1;
  uint uVar2;
  int iVar3;
  wchar_t *in_RDX;
  wchar_t *extraout_RDX;
  wchar_t *pwVar4;
  xemmai *this_00;
  long in_FS_OFFSET;
  wstring_view a_message;
  wstring_view a_message_00;
  wstring_view a_message_01;
  t_shared_lock_with_safe_region<std::shared_mutex> lock;
  t_shared_lock_with_safe_region<std::shared_mutex> local_20;
  
  ptVar1 = (this->super_t_sharable).super_t_owned.v_owner;
  if (ptVar1 != *(t_queue<128UL> **)(in_FS_OFFSET + -0x68)) {
    if (ptVar1 != (t_queue<128UL> *)0x0) {
      a_message._M_str = in_RDX;
      a_message._M_len = (size_t)L"owned by another thread.";
      f_throw((xemmai *)0x18,a_message);
    }
    t_shared_lock_with_safe_region<std::shared_mutex>::t_shared_lock_with_safe_region
              (&local_20,&(this->super_t_sharable).v_mutex);
    if ((this->super_t_sharable).super_t_owned.v_owner == (t_queue<128UL> *)0x0) {
      if (-1 < this->v_fd) {
        uVar2 = fcntl(this->v_fd,3);
        if ((uVar2 != 0xffffffff) &&
           (iVar3 = fcntl(this->v_fd,4,(ulong)((uint)!a_value << 0xb | uVar2 & 0xfffff7ff)),
           iVar3 != -1)) {
          if (local_20.super_shared_lock<std::shared_mutex>._M_owns != true) {
            return;
          }
          pthread_rwlock_unlock
                    ((pthread_rwlock_t *)local_20.super_shared_lock<std::shared_mutex>._M_pm);
          return;
        }
        portable::f_throw_system_error();
      }
      pwVar4 = L"already closed.";
      this_00 = (xemmai *)0xf;
    }
    else {
      pwVar4 = L"owned by another thread.";
      this_00 = (xemmai *)0x18;
    }
    a_message_00._M_str = extraout_RDX;
    a_message_00._M_len = (size_t)pwVar4;
    f_throw(this_00,a_message_00);
  }
  if (this->v_fd < 0) {
    a_message_01._M_str = in_RDX;
    a_message_01._M_len = (size_t)L"already closed.";
    f_throw((xemmai *)0xf,a_message_01);
  }
  uVar2 = fcntl(this->v_fd,3);
  if ((uVar2 != 0xffffffff) &&
     (iVar3 = fcntl(this->v_fd,4,(ulong)((uint)!a_value << 0xb | uVar2 & 0xfffff7ff)), iVar3 != -1))
  {
    return;
  }
  portable::f_throw_system_error();
}

Assistant:

void t_file::f_blocking__(bool a_value)
{
	f_owned_or_shared<t_shared_lock_with_safe_region>([&]
	{
		if (v_fd < 0) f_throw(L"already closed."sv);
		int flags = fcntl(v_fd, F_GETFL);
		if (flags == -1) portable::f_throw_system_error();
		if (a_value)
			flags &= ~O_NONBLOCK;
		else
			flags |= O_NONBLOCK;
		if (fcntl(v_fd, F_SETFL, flags) == -1) portable::f_throw_system_error();
	});
}